

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

bool __thiscall
sf::Shader::compile(Shader *this,char *vertexShaderCode,char *geometryShaderCode,
                   char *fragmentShaderCode)

{
  bool bVar1;
  GLhandleARB GVar2;
  GLhandleARB GVar3;
  ostream *poVar4;
  size_t sVar5;
  TransientContextLock lock;
  GLint success;
  char log [1024];
  TransientContextLock local_455;
  int local_454;
  char *local_450;
  char *local_448;
  char *local_440;
  GLcharARB local_438 [1032];
  
  local_450 = geometryShaderCode;
  local_448 = fragmentShaderCode;
  local_440 = vertexShaderCode;
  GlResource::TransientContextLock::TransientContextLock(&local_455);
  bVar1 = isAvailable();
  if (bVar1) {
    if ((local_450 != (char *)0x0) && (bVar1 = isGeometryAvailable(), !bVar1)) {
      poVar4 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"Failed to create a shader: your system doesn\'t support geometry shaders ",
                 0x48);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "(you should test Shader::isGeometryAvailable() before trying to use geometry shaders)"
                 ,0x55);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      goto LAB_001b8fc1;
    }
    if (this->m_shaderProgram != 0) {
      (*sf_glad_glDeleteObjectARB)(this->m_shaderProgram);
      this->m_shaderProgram = 0;
    }
    this->m_currentTexture = -1;
    std::
    _Rb_tree<int,_std::pair<const_int,_const_sf::Texture_*>,_std::_Select1st<std::pair<const_int,_const_sf::Texture_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
    ::clear(&(this->m_textures)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::clear(&(this->m_uniforms)._M_t);
    GVar2 = (*sf_glad_glCreateProgramObjectARB)();
    if (local_440 == (char *)0x0) {
LAB_001b90ad:
      if (local_450 != (char *)0x0) {
        GVar3 = (*sf_glad_glCreateShaderObjectARB)(0x8dd9);
        (*sf_glad_glShaderSourceARB)(GVar3,1,&local_450,(GLint *)0x0);
        (*sf_glad_glCompileShaderARB)(GVar3);
        (*sf_glad_glGetObjectParameterivARB)(GVar3,0x8b81,&local_454);
        if (local_454 == 0) {
          (*sf_glad_glGetInfoLogARB)(GVar3,0x400,(GLsizei *)0x0,local_438);
          poVar4 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"Failed to compile geometry shader:",0x22);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          poVar4 = (ostream *)std::ostream::flush();
          sVar5 = strlen(local_438);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_438,sVar5);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          (*sf_glad_glDeleteObjectARB)(GVar3);
          (*sf_glad_glDeleteObjectARB)(GVar2);
          goto LAB_001b8fd4;
        }
        (*sf_glad_glAttachObjectARB)(GVar2,GVar3);
        (*sf_glad_glDeleteObjectARB)(GVar3);
      }
      if (local_448 != (char *)0x0) {
        GVar3 = (*sf_glad_glCreateShaderObjectARB)(0x8b30);
        (*sf_glad_glShaderSourceARB)(GVar3,1,&local_448,(GLint *)0x0);
        (*sf_glad_glCompileShaderARB)(GVar3);
        (*sf_glad_glGetObjectParameterivARB)(GVar3,0x8b81,&local_454);
        if (local_454 == 0) {
          (*sf_glad_glGetInfoLogARB)(GVar3,0x400,(GLsizei *)0x0,local_438);
          poVar4 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"Failed to compile fragment shader:",0x22);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          poVar4 = (ostream *)std::ostream::flush();
          sVar5 = strlen(local_438);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_438,sVar5);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          (*sf_glad_glDeleteObjectARB)(GVar3);
          (*sf_glad_glDeleteObjectARB)(GVar2);
          goto LAB_001b8fd4;
        }
        (*sf_glad_glAttachObjectARB)(GVar2,GVar3);
        (*sf_glad_glDeleteObjectARB)(GVar3);
      }
      (*sf_glad_glLinkProgramARB)(GVar2);
      (*sf_glad_glGetObjectParameterivARB)(GVar2,0x8b82,&local_454);
      bVar1 = local_454 != 0;
      if (local_454 == 0) {
        (*sf_glad_glGetInfoLogARB)(GVar2,0x400,(GLsizei *)0x0,local_438);
        poVar4 = err();
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed to link shader:",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        poVar4 = (ostream *)std::ostream::flush();
        sVar5 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_438,sVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        (*sf_glad_glDeleteObjectARB)(GVar2);
      }
      else {
        this->m_shaderProgram = GVar2;
        (*sf_glad_glFlush)();
      }
      goto LAB_001b8fd6;
    }
    GVar3 = (*sf_glad_glCreateShaderObjectARB)(0x8b31);
    (*sf_glad_glShaderSourceARB)(GVar3,1,&local_440,(GLint *)0x0);
    (*sf_glad_glCompileShaderARB)(GVar3);
    (*sf_glad_glGetObjectParameterivARB)(GVar3,0x8b81,&local_454);
    if (local_454 != 0) {
      (*sf_glad_glAttachObjectARB)(GVar2,GVar3);
      (*sf_glad_glDeleteObjectARB)(GVar3);
      goto LAB_001b90ad;
    }
    (*sf_glad_glGetInfoLogARB)(GVar3,0x400,(GLsizei *)0x0,local_438);
    poVar4 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Failed to compile vertex shader:",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    sVar5 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_438,sVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    (*sf_glad_glDeleteObjectARB)(GVar3);
    (*sf_glad_glDeleteObjectARB)(GVar2);
  }
  else {
    poVar4 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Failed to create a shader: your system doesn\'t support shaders ",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "(you should test Shader::isAvailable() before trying to use the Shader class)",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
LAB_001b8fc1:
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
LAB_001b8fd4:
  bVar1 = false;
LAB_001b8fd6:
  GlResource::TransientContextLock::~TransientContextLock(&local_455);
  return bVar1;
}

Assistant:

bool Shader::compile(const char* vertexShaderCode, const char* geometryShaderCode, const char* fragmentShaderCode)
{
    TransientContextLock lock;

    // First make sure that we can use shaders
    if (!isAvailable())
    {
        err() << "Failed to create a shader: your system doesn't support shaders "
              << "(you should test Shader::isAvailable() before trying to use the Shader class)" << std::endl;
        return false;
    }

    // Make sure we can use geometry shaders
    if (geometryShaderCode && !isGeometryAvailable())
    {
        err() << "Failed to create a shader: your system doesn't support geometry shaders "
              << "(you should test Shader::isGeometryAvailable() before trying to use geometry shaders)" << std::endl;
        return false;
    }

    // Destroy the shader if it was already created
    if (m_shaderProgram)
    {
        glCheck(GLEXT_glDeleteObject(castToGlHandle(m_shaderProgram)));
        m_shaderProgram = 0;
    }

    // Reset the internal state
    m_currentTexture = -1;
    m_textures.clear();
    m_uniforms.clear();

    // Create the program
    GLEXT_GLhandle shaderProgram;
    glCheck(shaderProgram = GLEXT_glCreateProgramObject());

    // Create the vertex shader if needed
    if (vertexShaderCode)
    {
        // Create and compile the shader
        GLEXT_GLhandle vertexShader;
        glCheck(vertexShader = GLEXT_glCreateShaderObject(GLEXT_GL_VERTEX_SHADER));
        glCheck(GLEXT_glShaderSource(vertexShader, 1, &vertexShaderCode, NULL));
        glCheck(GLEXT_glCompileShader(vertexShader));

        // Check the compile log
        GLint success;
        glCheck(GLEXT_glGetObjectParameteriv(vertexShader, GLEXT_GL_OBJECT_COMPILE_STATUS, &success));
        if (success == GL_FALSE)
        {
            char log[1024];
            glCheck(GLEXT_glGetInfoLog(vertexShader, sizeof(log), 0, log));
            err() << "Failed to compile vertex shader:" << std::endl
                  << log << std::endl;
            glCheck(GLEXT_glDeleteObject(vertexShader));
            glCheck(GLEXT_glDeleteObject(shaderProgram));
            return false;
        }

        // Attach the shader to the program, and delete it (not needed anymore)
        glCheck(GLEXT_glAttachObject(shaderProgram, vertexShader));
        glCheck(GLEXT_glDeleteObject(vertexShader));
    }

    // Create the geometry shader if needed
    if (geometryShaderCode)
    {
        // Create and compile the shader
        GLEXT_GLhandle geometryShader = GLEXT_glCreateShaderObject(GLEXT_GL_GEOMETRY_SHADER);
        glCheck(GLEXT_glShaderSource(geometryShader, 1, &geometryShaderCode, NULL));
        glCheck(GLEXT_glCompileShader(geometryShader));

        // Check the compile log
        GLint success;
        glCheck(GLEXT_glGetObjectParameteriv(geometryShader, GLEXT_GL_OBJECT_COMPILE_STATUS, &success));
        if (success == GL_FALSE)
        {
            char log[1024];
            glCheck(GLEXT_glGetInfoLog(geometryShader, sizeof(log), 0, log));
            err() << "Failed to compile geometry shader:" << std::endl
                  << log << std::endl;
            glCheck(GLEXT_glDeleteObject(geometryShader));
            glCheck(GLEXT_glDeleteObject(shaderProgram));
            return false;
        }

        // Attach the shader to the program, and delete it (not needed anymore)
        glCheck(GLEXT_glAttachObject(shaderProgram, geometryShader));
        glCheck(GLEXT_glDeleteObject(geometryShader));
    }

    // Create the fragment shader if needed
    if (fragmentShaderCode)
    {
        // Create and compile the shader
        GLEXT_GLhandle fragmentShader;
        glCheck(fragmentShader = GLEXT_glCreateShaderObject(GLEXT_GL_FRAGMENT_SHADER));
        glCheck(GLEXT_glShaderSource(fragmentShader, 1, &fragmentShaderCode, NULL));
        glCheck(GLEXT_glCompileShader(fragmentShader));

        // Check the compile log
        GLint success;
        glCheck(GLEXT_glGetObjectParameteriv(fragmentShader, GLEXT_GL_OBJECT_COMPILE_STATUS, &success));
        if (success == GL_FALSE)
        {
            char log[1024];
            glCheck(GLEXT_glGetInfoLog(fragmentShader, sizeof(log), 0, log));
            err() << "Failed to compile fragment shader:" << std::endl
                  << log << std::endl;
            glCheck(GLEXT_glDeleteObject(fragmentShader));
            glCheck(GLEXT_glDeleteObject(shaderProgram));
            return false;
        }

        // Attach the shader to the program, and delete it (not needed anymore)
        glCheck(GLEXT_glAttachObject(shaderProgram, fragmentShader));
        glCheck(GLEXT_glDeleteObject(fragmentShader));
    }

    // Link the program
    glCheck(GLEXT_glLinkProgram(shaderProgram));

    // Check the link log
    GLint success;
    glCheck(GLEXT_glGetObjectParameteriv(shaderProgram, GLEXT_GL_OBJECT_LINK_STATUS, &success));
    if (success == GL_FALSE)
    {
        char log[1024];
        glCheck(GLEXT_glGetInfoLog(shaderProgram, sizeof(log), 0, log));
        err() << "Failed to link shader:" << std::endl
              << log << std::endl;
        glCheck(GLEXT_glDeleteObject(shaderProgram));
        return false;
    }

    m_shaderProgram = castFromGlHandle(shaderProgram);

    // Force an OpenGL flush, so that the shader will appear updated
    // in all contexts immediately (solves problems in multi-threaded apps)
    glCheck(glFlush());

    return true;
}